

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O2

void bcread_error(LexState *ls,ErrMsg em)

{
  char cVar1;
  lua_State *L;
  char *pcVar2;
  
  L = ls->L;
  pcVar2 = ls->chunkarg;
  cVar1 = *pcVar2;
  if (cVar1 == '\x1b') {
    pcVar2 = "(binary)";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    pcVar2 = pcVar2 + 1;
  }
  lj_strfmt_pushf(L,"%s: %s",pcVar2,lj_err_allmsg + em);
  lj_err_throw(L,3);
}

Assistant:

static LJ_NOINLINE void bcread_error(LexState *ls, ErrMsg em)
{
  lua_State *L = ls->L;
  const char *name = ls->chunkarg;
  if (*name == BCDUMP_HEAD1) name = "(binary)";
  else if (*name == '@' || *name == '=') name++;
  lj_strfmt_pushf(L, "%s: %s", name, err2msg(em));
  lj_err_throw(L, LUA_ERRSYNTAX);
}